

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_link_resolver.c
# Opt level: O0

void archive_entry_linkresolver_set_strategy(archive_entry_linkresolver *res,int fmt)

{
  uint uVar1;
  int fmtbase;
  int fmt_local;
  archive_entry_linkresolver *res_local;
  
  uVar1 = (uint)fmt >> 0x10 & 0xff;
  if (uVar1 == 1) {
    if (fmt == 0x10004 || fmt == 0x10005) {
      res->strategy = 3;
      return;
    }
    res->strategy = 2;
    return;
  }
  if (((uVar1 == 2) || (uVar1 == 3)) || (uVar1 == 4)) {
LAB_00c320f3:
    res->strategy = 0;
  }
  else {
    if ((uVar1 != 5) && (uVar1 != 7)) {
      if (uVar1 == 8) {
        res->strategy = 1;
        return;
      }
      if (uVar1 == 10) goto LAB_00c320f3;
      if (uVar1 != 0xe) {
        res->strategy = 2;
        return;
      }
    }
    res->strategy = 2;
  }
  return;
}

Assistant:

void
archive_entry_linkresolver_set_strategy(struct archive_entry_linkresolver *res,
    int fmt)
{
	int fmtbase = fmt & ARCHIVE_FORMAT_BASE_MASK;

	switch (fmtbase) {
	case ARCHIVE_FORMAT_7ZIP:
	case ARCHIVE_FORMAT_AR:
	case ARCHIVE_FORMAT_ZIP:
		res->strategy = ARCHIVE_ENTRY_LINKIFY_LIKE_OLD_CPIO;
		break;
	case ARCHIVE_FORMAT_CPIO:
		switch (fmt) {
		case ARCHIVE_FORMAT_CPIO_SVR4_NOCRC:
		case ARCHIVE_FORMAT_CPIO_SVR4_CRC:
			res->strategy = ARCHIVE_ENTRY_LINKIFY_LIKE_NEW_CPIO;
			break;
		default:
			res->strategy = ARCHIVE_ENTRY_LINKIFY_LIKE_OLD_CPIO;
			break;
		}
		break;
	case ARCHIVE_FORMAT_MTREE:
		res->strategy = ARCHIVE_ENTRY_LINKIFY_LIKE_MTREE;
		break;
	case ARCHIVE_FORMAT_ISO9660:
	case ARCHIVE_FORMAT_SHAR:
	case ARCHIVE_FORMAT_TAR:
	case ARCHIVE_FORMAT_XAR:
		res->strategy = ARCHIVE_ENTRY_LINKIFY_LIKE_TAR;
		break;
	default:
		res->strategy = ARCHIVE_ENTRY_LINKIFY_LIKE_OLD_CPIO;
		break;
	}
}